

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O3

bool __thiscall
ADPlanner::Search(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,
                 vector<int,_std::allocator<int>_> *pathIds,int *PathCost,bool bFirstSolution,
                 bool bOptimalSolution,double MaxNumofSecs)

{
  pointer *ppPVar1;
  double dVar2;
  DiscreteSpaceInformation *pDVar3;
  pointer pPVar4;
  iterator __position;
  pointer piVar5;
  pointer piVar6;
  unsigned_short uVar7;
  int iVar8;
  clock_t cVar9;
  clock_t cVar10;
  bool bVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int solcost;
  PlannerStats tempStat;
  double local_88;
  undefined4 local_7c;
  undefined1 local_78 [8];
  pointer piStack_70;
  pointer local_68;
  int iStack_60;
  undefined4 uStack_5c;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  int *local_48;
  vector<PlannerStats,std::allocator<PlannerStats>> *local_40;
  double local_38;
  
  local_58 = pathIds;
  local_48 = PathCost;
  cVar9 = clock();
  this->TimeStarted = cVar9;
  this->searchexpands = 0;
  local_50 = this->repair_time;
  if (this->use_repair_time == false) {
    this->repair_time = MaxNumofSecs;
  }
  if (pSearchStateSpace->bReevaluatefvals == true) {
    pDVar3 = (this->super_SBPLPlanner).environment_;
    (*pDVar3->_vptr_DiscreteSpaceInformation[0x19])(pDVar3,(ulong)this->bforwardsearch);
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x28])(this,pSearchStateSpace);
  }
  if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2c])(this,pSearchStateSpace);
  }
  if (bOptimalSolution) {
    pSearchStateSpace->eps = 1.0;
  }
  else {
    local_88 = MaxNumofSecs;
    if (!bFirstSolution) goto LAB_00135ac9;
  }
  this->repair_time = 1000000000.0;
  local_88 = 1000000000.0;
LAB_00135ac9:
  pPVar4 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar4;
  }
  local_40 = (vector<PlannerStats,std::allocator<PlannerStats>> *)&this->stats;
  local_38 = local_88 * 1000000.0;
  uVar12 = 0;
  while (((this->final_epsilon <= pSearchStateSpace->eps_satisfied &&
           pSearchStateSpace->eps_satisfied != this->final_epsilon &&
          (cVar9 = clock(), (double)(cVar9 - this->TimeStarted) < local_38)) &&
         (((pSearchStateSpace->eps_satisfied == 1000000000.0 &&
           (!NAN(pSearchStateSpace->eps_satisfied))) ||
          (cVar9 = clock(), (double)(cVar9 - this->TimeStarted) < this->repair_time * 1000000.0)))))
  {
    cVar9 = clock();
    uVar7 = pSearchStateSpace->searchiteration;
    if (uVar7 == 0) {
      pSearchStateSpace->searchiteration = 1;
      uVar7 = 1;
    }
    if (ABS(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < 1e-07 && !bFirstSolution) {
      dVar2 = pSearchStateSpace->eps - this->dec_eps;
      pSearchStateSpace->eps = dVar2;
      if (dVar2 < this->final_epsilon) {
        pSearchStateSpace->eps = this->final_epsilon;
      }
      pSearchStateSpace->bReevaluatefvals = true;
      pSearchStateSpace->bRebuildOpenList = true;
      pSearchStateSpace->searchiteration = uVar7 + 1;
LAB_00135be5:
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x26])(this,pSearchStateSpace);
    }
    else if ((pSearchStateSpace->bRebuildOpenList & 1U) != 0) goto LAB_00135be5;
    if (pSearchStateSpace->bReevaluatefvals == true) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x27])(this,pSearchStateSpace);
    }
    iVar8 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x25])
                      (SUB84(local_88,0),this,pSearchStateSpace);
    if (iVar8 == 1) {
      dVar2 = pSearchStateSpace->eps;
      uVar13 = SUB84(dVar2,0);
      uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
      pSearchStateSpace->eps_satisfied = dVar2;
    }
    else {
      uVar13 = SUB84(pSearchStateSpace->eps_satisfied,0);
      uVar14 = (undefined4)((ulong)pSearchStateSpace->eps_satisfied >> 0x20);
    }
    dVar2 = this->finitial_eps;
    if ((double)CONCAT44(uVar14,uVar13) == dVar2) {
      if ((pSearchStateSpace->eps == dVar2) && (!NAN(pSearchStateSpace->eps) && !NAN(dVar2))) {
        cVar10 = clock();
        this->finitial_eps_planning_time = (double)(cVar10 - cVar9) / 1000000.0;
        this->num_of_expands_initial_solution = this->searchexpands - uVar12;
        uVar13 = SUB84(pSearchStateSpace->eps_satisfied,0);
        uVar14 = (undefined4)((ulong)pSearchStateSpace->eps_satisfied >> 0x20);
      }
    }
    pPVar4 = (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
        super__Vector_impl_data._M_start == pPVar4) {
LAB_00135c92:
      local_78 = (undefined1  [8])CONCAT44(uVar14,uVar13);
      iStack_60 = this->searchexpands - uVar12;
      cVar10 = clock();
      local_68 = (pointer)((double)(cVar10 - cVar9) / 1000000.0);
      piStack_70 = (pointer)CONCAT44(piStack_70._4_4_,
                                     *(undefined4 *)
                                      ((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData
                                      + 0x24));
      __position._M_current =
           (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<PlannerStats,std::allocator<PlannerStats>>::
        _M_realloc_insert<PlannerStats_const&>(local_40,__position,(PlannerStats *)local_78);
      }
      else {
        (__position._M_current)->time = (double)local_68;
        *(ulong *)&(__position._M_current)->expands = CONCAT44(uStack_5c,iStack_60);
        (__position._M_current)->eps = (double)local_78;
        *(pointer *)&(__position._M_current)->cost = piStack_70;
        ppPVar1 = &(this->stats).super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
    }
    else {
      pPVar4 = pPVar4 + -1;
      if (((double)CONCAT44(uVar14,uVar13) != pPVar4->eps) ||
         (NAN((double)CONCAT44(uVar14,uVar13)) || NAN(pPVar4->eps))) goto LAB_00135c92;
    }
    if ((bFirstSolution) ||
       (uVar12 = this->searchexpands,
       *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24) == 1000000000)
       ) break;
  }
  this->repair_time = local_50;
  *local_48 = *(int *)((long)pSearchStateSpace->searchgoalstate->PlannerSpecificData + 0x24);
  pDVar3 = (this->super_SBPLPlanner).environment_;
  this->MaxMemoryCounter =
       this->MaxMemoryCounter +
       ((uint)((ulong)((long)(pDVar3->StateID2IndexMapping).
                             super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pDVar3->StateID2IndexMapping).
                            super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 1) & 0xfffffffc);
  local_7c = 1000000000;
  if ((*local_48 == 1000000000) ||
     ((dVar2 = this->pSearchStateSpace_->eps_satisfied, dVar2 == 1000000000.0 && (!NAN(dVar2))))) {
    bVar11 = false;
  }
  else {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x34])(local_78,this,pSearchStateSpace,&local_7c);
    piVar5 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_78;
    (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piStack_70;
    (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_68;
    local_78 = (undefined1  [8])0x0;
    piStack_70 = (pointer)0x0;
    local_68 = (pointer)0x0;
    if ((piVar5 != (pointer)0x0) &&
       (operator_delete(piVar5,(long)piVar6 - (long)piVar5), local_78 != (undefined1  [8])0x0)) {
      operator_delete((void *)local_78,(long)local_68 - (long)local_78);
    }
    bVar11 = true;
  }
  cVar9 = clock();
  this->final_eps_planning_time = (double)(cVar9 - this->TimeStarted) / 1000000.0;
  this->final_eps = pSearchStateSpace->eps_satisfied;
  return bVar11;
}

Assistant:

bool ADPlanner::Search(ADSearchStateSpace_t* pSearchStateSpace, vector<int>& pathIds, int & PathCost,
                       bool bFirstSolution, bool bOptimalSolution, double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    searchexpands = 0;
    double old_repair_time = repair_time;
    if (!use_repair_time) repair_time = MaxNumofSecs;

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    if (pSearchStateSpace->bReevaluatefvals) {
        // costs have changed or a new goal has been set
        environment_->EnsureHeuristicsUpdated(bforwardsearch);
        Reevaluatehvals(pSearchStateSpace);
    }


    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace(pSearchStateSpace);
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }

    //the main loop of AD*
    stats.clear();
    int prevexpands = 0;
    clock_t loop_time;
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC &&
               (pSearchStateSpace->eps_satisfied == INFINITECOST ||
               (clock() - TimeStarted) < repair_time * (double)CLOCKS_PER_SEC))
    {
        loop_time = clock();
        //it will be a new search iteration
        if (pSearchStateSpace->searchiteration == 0) pSearchStateSpace->searchiteration++;

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            pSearchStateSpace->bReevaluatefvals = true;
            pSearchStateSpace->bRebuildOpenList = true;

            pSearchStateSpace->searchiteration++;
        }

        //build a new open list by merging it with incons one
        if (pSearchStateSpace->bRebuildOpenList) BuildNewOPENList(pSearchStateSpace);

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals(pSearchStateSpace);

        //improve or compute path
        if (ComputePath(pSearchStateSpace, MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps;
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                    ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);

        if (pSearchStateSpace->eps_satisfied == finitial_eps && pSearchStateSpace->eps == finitial_eps) {
            finitial_eps_planning_time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            num_of_expands_initial_solution = searchexpands - prevexpands;
        }

        if (stats.empty() || pSearchStateSpace->eps_satisfied != stats.back().eps) {
            PlannerStats tempStat;
            tempStat.eps = pSearchStateSpace->eps_satisfied;
            tempStat.expands = searchexpands - prevexpands;
            tempStat.time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            tempStat.cost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
            stats.push_back(tempStat);
        }

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f eps_sat=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps,
                     pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                     ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);
#endif
        prevexpands = searchexpands;

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;

    }
    repair_time = old_repair_time;

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
    MaxMemoryCounter += environment_->StateID2IndexMapping.size() * sizeof(int);

    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    int solcost = INFINITECOST;
    bool ret = false;
    if (PathCost == INFINITECOST || pSearchStateSpace_->eps_satisfied == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");

        pathIds = GetSearchPath(pSearchStateSpace, solcost);
        ret = true;
    }

    SBPL_PRINTF("total expands this call = %d, planning time = %.3f secs, solution cost=%d\n", searchexpands, (clock()
        - TimeStarted) / ((double)CLOCKS_PER_SEC), solcost);
    final_eps_planning_time = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
    final_eps = pSearchStateSpace->eps_satisfied;

    //SBPL_FPRINTF(fStat, "%d %d\n", searchexpands, solcost);

    return ret;

}